

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
tinyusdz::tydra::anon_unknown_6::GetPrimProperty<tinyusdz::BlendShape>
          (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,BlendShape *blendshape,string *prop_name,Property *out_prop)

{
  bool bVar1;
  pointer ppVar2;
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_true>
  *value;
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_true>
  *value_00;
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_true>
  *value_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  bool local_19a;
  bool local_199;
  _Self local_198;
  _Self local_190;
  const_iterator it;
  string local_180 [32];
  string local_160;
  undefined1 local_140 [40];
  string local_118 [32];
  string local_f8;
  undefined1 local_d8 [40];
  string local_b0 [32];
  string local_90;
  undefined1 local_70 [32];
  undefined1 local_50 [8];
  string err;
  Property *out_prop_local;
  string *prop_name_local;
  BlendShape *blendshape_local;
  
  if (out_prop == (Property *)0x0) {
    err.field_2._8_8_ =
         nonstd::expected_lite::make_unexpected<char_const(&)[59]>
                   ((char (*) [59])"[InternalError] nullptr in output Property is not allowed.");
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>
              (__return_storage_ptr__,(unexpected_type<const_char_*> *)((long)&err.field_2 + 8));
    return __return_storage_ptr__;
  }
  ::std::__cxx11::string::string((string *)local_50);
  bVar1 = ::std::operator==(prop_name,"offsets");
  if (bVar1) {
    bVar1 = (anonymous_namespace)::
            ToProperty<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                      (&blendshape->offsets,out_prop,(string *)local_50);
    if (!bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_b0,"Convert Property {} failed: {}\n",(allocator *)(local_d8 + 0x27));
      fmt::format<char[8],std::__cxx11::string>
                (&local_90,(fmt *)local_b0,(string *)"offsets",(char (*) [8])local_50,in_R8);
      nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                ((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_70,(expected_lite *)&local_90,value);
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (__return_storage_ptr__,
                 (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_70);
      nonstd::expected_lite::
      unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~unexpected_type((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_70);
      ::std::__cxx11::string::~string((string *)&local_90);
      ::std::__cxx11::string::~string(local_b0);
      ::std::allocator<char>::~allocator((allocator<char> *)(local_d8 + 0x27));
      goto LAB_004a69bf;
    }
  }
  else {
    bVar1 = ::std::operator==(prop_name,"normalOffsets");
    if (bVar1) {
      bVar1 = (anonymous_namespace)::
              ToProperty<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                        (&blendshape->normalOffsets,out_prop,(string *)local_50);
      if (!bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_118,"Convert Property {} failed: {}\n",(allocator *)(local_140 + 0x27));
        fmt::format<char[14],std::__cxx11::string>
                  (&local_f8,(fmt *)local_118,(string *)"normalOffsets",(char (*) [14])local_50,
                   in_R8);
        nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                  ((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_d8,(expected_lite *)&local_f8,value_00);
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (__return_storage_ptr__,
                   (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_d8);
        nonstd::expected_lite::
        unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~unexpected_type((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_d8);
        ::std::__cxx11::string::~string((string *)&local_f8);
        ::std::__cxx11::string::~string(local_118);
        ::std::allocator<char>::~allocator((allocator<char> *)(local_140 + 0x27));
        goto LAB_004a69bf;
      }
    }
    else {
      bVar1 = ::std::operator==(prop_name,"pointIndices");
      if (bVar1) {
        bVar1 = (anonymous_namespace)::ToProperty<std::vector<int,std::allocator<int>>>
                          (&blendshape->pointIndices,out_prop,(string *)local_50);
        if (!bVar1) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_180,"Convert Property {} failed: {}\n",
                     (allocator *)((long)&it._M_node + 7));
          fmt::format<char[13],std::__cxx11::string>
                    (&local_160,(fmt *)local_180,(string *)"pointIndices",(char (*) [13])local_50,
                     in_R8);
          nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                    ((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_140,(expected_lite *)&local_160,value_01);
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (__return_storage_ptr__,
                     (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_140);
          nonstd::expected_lite::
          unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~unexpected_type((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_140);
          ::std::__cxx11::string::~string((string *)&local_160);
          ::std::__cxx11::string::~string(local_180);
          ::std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_node + 7));
          goto LAB_004a69bf;
        }
      }
      else {
        local_190._M_node =
             (_Base_ptr)
             ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                     *)&blendshape->props,prop_name);
        local_198._M_node =
             (_Base_ptr)
             ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                    *)&blendshape->props);
        bVar1 = ::std::operator==(&local_190,&local_198);
        if (bVar1) {
          local_199 = false;
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::expected<bool,_0>(__return_storage_ptr__,&local_199);
          goto LAB_004a69bf;
        }
        ppVar2 = ::std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
                 ::operator->(&local_190);
        Property::operator=(out_prop,&ppVar2->second);
      }
    }
  }
  local_19a = true;
  nonstd::expected_lite::
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  expected<bool,_0>(__return_storage_ptr__,&local_19a);
LAB_004a69bf:
  local_d8._32_4_ = 1;
  ::std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<bool, std::string> GetPrimProperty(
    const BlendShape &blendshape, const std::string &prop_name,
    Property *out_prop) {
  if (!out_prop) {
    return nonstd::make_unexpected(
        "[InternalError] nullptr in output Property is not allowed.");
  }

  DCOUT("prop_name = " << prop_name);
  std::string err;

  TO_PROPERTY("offsets", blendshape.offsets)
  TO_PROPERTY("normalOffsets", blendshape.normalOffsets)
  TO_PROPERTY("pointIndices", blendshape.pointIndices)

  {
    const auto it = blendshape.props.find(prop_name);
    if (it == blendshape.props.end()) {
      // Attribute not found.
      return false;
    }

    (*out_prop) = it->second;
  }
  DCOUT("Prop found: " << prop_name
                       << ", ty = " << out_prop->value_type_name());
  return true;
}